

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

void borg_follow_kill(wchar_t i)

{
  short sVar1;
  short sVar2;
  wchar_t x_00;
  wchar_t y_00;
  borg_grid *pbVar3;
  chunk_conflict *c;
  _Bool _Var4;
  uint32_t uVar5;
  wchar_t x_01;
  wchar_t y_01;
  borg_kill *pbVar6;
  char *pcVar7;
  loc_conflict grid;
  borg_kill *kill;
  borg_grid *ag;
  wchar_t b_dy;
  wchar_t dy;
  wchar_t b_dx;
  wchar_t dx;
  wchar_t oy;
  wchar_t ox;
  wchar_t y;
  wchar_t x;
  wchar_t j;
  wchar_t i_local;
  
  b_dy = L'\0';
  ag._0_4_ = 0;
  pbVar6 = borg_kills + i;
  if (pbVar6->r_idx != 0) {
    x_00 = (pbVar6->pos).x;
    y_00 = (pbVar6->pos).y;
    _Var4 = borg_follow_kill_aux(i,y_00,x_00);
    if (_Var4) {
      pcVar7 = borg_race_name((uint)pbVar6->r_idx);
      pcVar7 = format("# There was a monster \'%s\' at (%d,%d)",pcVar7,(ulong)(uint)y_00,
                      (ulong)(uint)x_00);
      borg_note(pcVar7);
      _Var4 = borg_cave_floor_bold(y_00,x_00);
      if (_Var4) {
        uVar5 = Rand_div(100);
        if ((int)(uVar5 + 1) < 1) {
          borg_delete_kill(i);
        }
        else if (borg_t < 0x4e21) {
          _Var4 = flag_has_dbg(r_info[pbVar6->r_idx].flags,0xb,0x15,"r_info[kill->r_idx].flags",
                               "RF_NEVER_MOVE");
          if ((_Var4) || ((pbVar6->awake & 1U) == 0)) {
            if (((pbVar6->pos).y == borg.c.y) && ((pbVar6->pos).x == borg.c.x)) {
              borg_delete_kill(i);
            }
          }
          else {
            for (y = L'\0'; c = cave, y < L'\b'; y = y + L'\x01') {
              sVar1 = ddx_ddd[y];
              sVar2 = ddy_ddd[y];
              x_01 = x_00 + sVar1;
              y_01 = y_00 + sVar2;
              grid = (loc_conflict)loc(x_01,y_01);
              _Var4 = square_in_bounds_fully((chunk *)c,grid);
              if (_Var4) {
                pbVar3 = borg_grids[y_01];
                _Var4 = borg_cave_floor_grid(pbVar3 + x_01);
                if (((_Var4) && (pbVar3[x_01].kill == '\0')) &&
                   (_Var4 = borg_follow_kill_aux(i,y_01,x_01), !_Var4)) {
                  b_dy = sVar1 + b_dy;
                  ag._0_4_ = sVar2 + (int)ag;
                }
              }
            }
            if (b_dy < L'\xffffffff') {
              b_dy = L'\xffffffff';
            }
            else if (L'\x01' < b_dy) {
              b_dy = L'\x01';
            }
            if ((int)ag < -1) {
              ag._0_4_ = -1;
            }
            else if (1 < (int)ag) {
              ag._0_4_ = 1;
            }
            pbVar3 = borg_grids[y_00 + (int)ag];
            _Var4 = borg_cave_floor_grid(pbVar3 + (x_00 + b_dy));
            if (_Var4) {
              if ((uint)pbVar3[x_00 + b_dy].kill == i) {
                if (((pbVar6->pos).y == y_00) && ((pbVar6->pos).x == x_00)) {
                  borg_delete_kill(i);
                }
                else {
                  borg_grids[(pbVar6->pos).y][(pbVar6->pos).x].kill = '\0';
                  pbVar6->ox = (uint8_t)x_00;
                  pbVar6->oy = (uint8_t)y_00;
                  (pbVar6->pos).x = x_00 + b_dy;
                  (pbVar6->pos).y = y_00 + (int)ag;
                  borg_grids[(pbVar6->pos).y][(pbVar6->pos).x].kill = (uint8_t)i;
                  pcVar7 = borg_race_name((uint)pbVar6->r_idx);
                  pcVar7 = format("# Following a monster \'%s\' to (%d,%d) from (%d,%d)",pcVar7,
                                  (ulong)(uint)(pbVar6->pos).y,(ulong)(uint)(pbVar6->pos).x,
                                  (ulong)(uint)y_00,(ulong)(uint)x_00);
                  borg_note(pcVar7);
                  borg_danger_wipe = true;
                  if ((((borg.trait[0x25] == 0) &&
                       ((borg.goal.type == 1 && ((uint)borg_flow_y[0] == (pbVar6->pos).y)))) &&
                      ((uint)borg_flow_x[0] == (pbVar6->pos).x)) ||
                     ((borg.goal.type == 2 && ((borg.munchkin_mode & 1U) != 0)))) {
                    borg.goal.type = 0;
                  }
                }
              }
              else {
                borg_delete_kill(i);
              }
            }
            else {
              borg_delete_kill(i);
            }
          }
        }
        else {
          borg_delete_kill(i);
        }
      }
      else {
        borg_delete_kill(i);
      }
    }
  }
  return;
}

Assistant:

void borg_follow_kill(int i)
{
    int j;
    int x, y;
    int ox, oy;

    int dx, b_dx = 0;
    int dy, b_dy = 0;

    borg_grid *ag;

    borg_kill *kill = &borg_kills[i];

    /* Paranoia */
    if (!kill->r_idx)
        return;

    /* Old location */
    ox = kill->pos.x;
    oy = kill->pos.y;

    /* Out of sight */
    if (!borg_follow_kill_aux(i, oy, ox))
        return;

    /* Note */
    borg_note(format("# There was a monster '%s' at (%d,%d)",
        borg_race_name(kill->r_idx), oy, ox));

    /* Prevent silliness */
    if (!borg_cave_floor_bold(oy, ox)) {
        /* Delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Prevent loops */
    if (randint1(100) < 1) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* prevent overflows */
    if (borg_t > 20000) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Some never move, no reason to follow them */
    if ((rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE)) ||
        /* Some are sleeping and don't move, no reason to follow them */
        (kill->awake == false)) {
        /* delete them if they are under me */
        if (kill->pos.y == borg.c.y && kill->pos.x == borg.c.x) {
            borg_delete_kill(i);
        }
        /* Don't 'forget' certain ones */
        return;
    }

    /* Scan locations */
    for (j = 0; j < 8; j++) {
        /* Access offset */
        dx = ddx_ddd[j];
        dy = ddy_ddd[j];

        /* Access location */
        x = ox + dx;
        y = oy + dy;

        /* legal */
        if (!square_in_bounds_fully(cave, loc(x, y)))
            continue;

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Skip known walls and doors */
        if (!borg_cave_floor_grid(ag))
            continue;

        /* Skip known monsters */
        if (ag->kill)
            continue;

        /* Skip visible grids */
        if (borg_follow_kill_aux(i, y, x))
            continue;

        /* Collect the offsets */
        b_dx += dx;
        b_dy += dy;
    }

    /* Don't go too far */
    if (b_dx < -1)
        b_dx = -1;
    else if (b_dx > 1)
        b_dx = 1;

    /* Don't go too far */
    if (b_dy < -1)
        b_dy = -1;
    else if (b_dy > 1)
        b_dy = 1;

    /* Access location */
    x = ox + b_dx;
    y = oy + b_dy;

    /* Access the grid */
    ag = &borg_grids[y][x];

    /* Avoid walls and doors */
    if (!borg_cave_floor_grid(ag)) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Avoid monsters */
    if (ag->kill != i) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Delete monsters that did not really move */
    if (kill->pos.y == oy && kill->pos.x == ox) {
        borg_delete_kill(i);
        return;
    }

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = 0;

    /* Save the old Location */
    kill->ox = ox;
    kill->oy = oy;

    /* Save the Location */
    kill->pos.x = ox + b_dx;
    kill->pos.y = oy + b_dy;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = i;

    /* Note */
    borg_note(format("# Following a monster '%s' to (%d,%d) from (%d,%d)",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, oy, ox));

    /* Recalculate danger */
    borg_danger_wipe = true;

    /* Clear goals */
    if ((!borg.trait[BI_ESP] && borg.goal.type == GOAL_KILL
            && (borg_flow_y[0] == kill->pos.y && borg_flow_x[0] == kill->pos.x))
        || (borg.goal.type == GOAL_TAKE && borg.munchkin_mode))
        borg.goal.type = 0;
}